

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::ObjFileImporter::CreateDataFromImport(ObjFileImporter *this,Model *pModel,aiScene *pScene)

{
  undefined4 uVar1;
  pointer ppOVar2;
  Object *pOVar3;
  pointer paVar4;
  pointer paVar5;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> uVar6;
  size_t index_2;
  aiNode *this_00;
  aiNode **ppaVar7;
  aiMesh **ppaVar8;
  tuple<aiMesh_*,_std::default_delete<aiMesh>_> this_01;
  aiVector3D *paVar9;
  aiColor4D *__s;
  long lVar10;
  uint *puVar11;
  __uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true> *p_Var12;
  DeadlyImportError *pDVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  pointer ppaVar17;
  ulong uVar18;
  uint uVar19;
  size_t index_1;
  ulong uVar20;
  pointer ppaVar21;
  ulong __n;
  allocator<char> local_81;
  aiVector3D *local_80;
  _Head_base<0UL,_aiMesh_*,_false> local_78;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> mesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> MeshArray;
  
  if (pModel != (Model *)0x0) {
    this_00 = (aiNode *)operator_new(0x478);
    aiNode::aiNode(this_00);
    pScene->mRootNode = this_00;
    uVar20 = (pModel->m_ModelName)._M_string_length;
    if (uVar20 == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                    ,0xaf,
                    "void Assimp::ObjFileImporter::CreateDataFromImport(const ObjFile::Model *, aiScene *)"
                   );
    }
    if (uVar20 < 0x400) {
      (this_00->mName).length = (ai_uint32)uVar20;
      memcpy((this_00->mName).data,(pModel->m_ModelName)._M_dataplus._M_p,uVar20);
      (this_00->mName).data[uVar20] = '\0';
    }
    ppOVar2 = (pModel->m_Objects).
              super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar14 = (long)(pModel->m_Objects).
                   super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2;
    if (lVar14 == 0) {
      if ((pModel->m_Vertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pModel->m_Vertices).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>)operator_new(0x520);
        aiMesh::aiMesh((aiMesh *)
                       this_01.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
        *(undefined4 *)
         this_01.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl = 1;
        local_80 = (pModel->m_Vertices).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        lVar14 = 0xc;
        uVar20 = ((long)(pModel->m_Vertices).
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)local_80) / 0xc;
        *(uint *)((long)this_01.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = (uint)uVar20;
        uVar18 = uVar20 & 0xffffffff;
        __n = uVar18 * 0xc;
        local_78._M_head_impl =
             (aiMesh *)
             this_01.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
        mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
             (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
             this_01.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
        paVar9 = (aiVector3D *)operator_new__(__n);
        if (uVar18 != 0) {
          memset(paVar9,0,((__n - 0xc) - (__n - 0xc) % 0xc) + 0xc);
        }
        (local_78._M_head_impl)->mVertices = paVar9;
        memcpy(paVar9,local_80,__n);
        paVar4 = (pModel->m_Normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        paVar5 = (pModel->m_Normals).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (paVar4 != paVar5) {
          paVar9 = (aiVector3D *)operator_new__(__n);
          if (uVar18 != 0) {
            local_80 = paVar9;
            memset(paVar9,0,((__n - 0xc) - (__n - 0xc) % 0xc) + 0xc);
            paVar9 = local_80;
          }
          (local_78._M_head_impl)->mNormals = paVar9;
          if ((ulong)(((long)paVar5 - (long)paVar4) / 0xc) < uVar18) {
            pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&MeshArray,"OBJ: vertex normal index out of range",&local_81);
            DeadlyImportError::DeadlyImportError(pDVar13,(string *)&MeshArray);
            __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          memcpy(paVar9,paVar4,__n);
        }
        if ((pModel->m_VertexColors).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (pModel->m_VertexColors).
            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar18 = (uVar20 & 0xffffffff) << 4;
          __s = (aiColor4D *)operator_new__(uVar18);
          if ((uint)uVar20 != 0) {
            memset(__s,0,uVar18);
          }
          (local_78._M_head_impl)->mColors[0] = __s;
          lVar15 = 8;
          for (uVar18 = 0; (uVar20 & 0xffffffff) != uVar18; uVar18 = uVar18 + 1) {
            paVar4 = (pModel->m_VertexColors).
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            lVar10 = (long)(pModel->m_VertexColors).
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)paVar4;
            if ((ulong)(lVar10 / 0xc) <= uVar18) {
              pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10,uVar18,lVar10 % 0xc);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&MeshArray,"OBJ: vertex color index out of range",&local_81);
              DeadlyImportError::DeadlyImportError(pDVar13,(string *)&MeshArray);
              __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar1 = *(undefined4 *)((long)&paVar4->x + lVar15);
            lVar10 = *(long *)((long)mesh._M_t.
                                     super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30);
            *(undefined8 *)(lVar10 + -0xc + lVar14) = *(undefined8 *)((long)paVar4 + lVar15 + -8);
            *(undefined4 *)(lVar10 + -4 + lVar14) = uVar1;
            *(undefined4 *)(lVar10 + lVar14) = 0x3f800000;
            lVar14 = lVar14 + 0x10;
            lVar15 = lVar15 + 0xc;
          }
        }
        pScene->mRootNode->mNumMeshes = 1;
        puVar11 = (uint *)operator_new__(4);
        pScene->mRootNode->mMeshes = puVar11;
        *pScene->mRootNode->mMeshes = 0;
        p_Var12 = (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true> *)
                  operator_new__(8);
        uVar6 = mesh;
        pScene->mMeshes = (aiMesh **)p_Var12;
        pScene->mNumMeshes = 1;
        mesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
             (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)0x0;
        p_Var12->super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_> =
             (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)
             uVar6._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
             super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
        std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&mesh);
      }
    }
    else {
      uVar19 = 0;
      uVar16 = 0;
      for (lVar15 = 0; lVar14 >> 3 != lVar15; lVar15 = lVar15 + 1) {
        pOVar3 = ppOVar2[lVar15];
        if (pOVar3 != (Object *)0x0) {
          uVar16 = uVar16 + 1;
          uVar19 = uVar19 + (int)((ulong)((long)*(pointer *)
                                                 ((long)&(pOVar3->m_Meshes).
                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) -
                                         *(long *)&(pOVar3->m_Meshes).
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data) >> 2);
        }
      }
      ppaVar7 = (aiNode **)operator_new__((ulong)uVar16 << 3);
      this_00->mChildren = ppaVar7;
      MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&MeshArray,(ulong)uVar19);
      for (uVar20 = 0;
          ppaVar21 = MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,
          ppaVar17 = MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
          ppOVar2 = (pModel->m_Objects).
                    super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          uVar20 < (ulong)((long)(pModel->m_Objects).
                                 super__Vector_base<Assimp::ObjFile::Object_*,_std::allocator<Assimp::ObjFile::Object_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppOVar2 >> 3);
          uVar20 = uVar20 + 1) {
        createNodes(this,pModel,ppOVar2[uVar20],pScene->mRootNode,pScene,&MeshArray);
      }
      if (pScene->mRootNode->mNumChildren != uVar16) {
        __assert_fail("pScene->mRootNode->mNumChildren == childCount",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Obj/ObjFileImporter.cpp"
                      ,200,
                      "void Assimp::ObjFileImporter::CreateDataFromImport(const ObjFile::Model *, aiScene *)"
                     );
      }
      if (pScene->mNumMeshes != 0) {
        uVar20 = 0xffffffffffffffff;
        if (-1 < (long)MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                       super__Vector_impl_data._M_start) {
          uVar20 = (long)MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_start;
        }
        ppaVar8 = (aiMesh **)operator_new__(uVar20);
        pScene->mMeshes = ppaVar8;
        for (uVar20 = 0; uVar20 < (ulong)((long)ppaVar21 - (long)ppaVar17 >> 3); uVar20 = uVar20 + 1
            ) {
          pScene->mMeshes[uVar20] = ppaVar17[uVar20];
          ppaVar17 = MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppaVar21 = MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
      }
      createMaterials(this,pModel,pScene);
      std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
                (&MeshArray.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
    }
  }
  return;
}

Assistant:

void ObjFileImporter::CreateDataFromImport(const ObjFile::Model* pModel, aiScene* pScene) {
    if( 0L == pModel ) {
        return;
    }

    // Create the root node of the scene
    pScene->mRootNode = new aiNode;
    if ( !pModel->m_ModelName.empty() ) {
        // Set the name of the scene
        pScene->mRootNode->mName.Set(pModel->m_ModelName);
    } else {
        // This is a fatal error, so break down the application
        ai_assert(false);
    }

    if (pModel->m_Objects.size() > 0) {

        unsigned int meshCount = 0;
        unsigned int childCount = 0;

        for(size_t index = 0; index < pModel->m_Objects.size(); ++index) {
            if(pModel->m_Objects[index]) {
                ++childCount;
                meshCount += (unsigned int)pModel->m_Objects[index]->m_Meshes.size();
            }
        }

        // Allocate space for the child nodes on the root node
        pScene->mRootNode->mChildren = new aiNode*[ childCount ];

        // Create nodes for the whole scene
        std::vector<aiMesh*> MeshArray;
        MeshArray.reserve(meshCount);
        for (size_t index = 0; index < pModel->m_Objects.size(); ++index) {
            createNodes(pModel, pModel->m_Objects[index], pScene->mRootNode, pScene, MeshArray);
        }

        ai_assert(pScene->mRootNode->mNumChildren == childCount);

        // Create mesh pointer buffer for this scene
        if (pScene->mNumMeshes > 0) {
            pScene->mMeshes = new aiMesh*[MeshArray.size()];
            for (size_t index = 0; index < MeshArray.size(); ++index) {
                pScene->mMeshes[index] = MeshArray[index];
            }
        }

        // Create all materials
        createMaterials(pModel, pScene);
    }else {
		if (pModel->m_Vertices.empty()){
			return;
		}

		std::unique_ptr<aiMesh> mesh( new aiMesh );
        mesh->mPrimitiveTypes = aiPrimitiveType_POINT;
        unsigned int n = (unsigned int)pModel->m_Vertices.size();
        mesh->mNumVertices = n;

        mesh->mVertices = new aiVector3D[n];
        memcpy(mesh->mVertices, pModel->m_Vertices.data(), n*sizeof(aiVector3D) );

        if ( !pModel->m_Normals.empty() ) {
            mesh->mNormals = new aiVector3D[n];
            if (pModel->m_Normals.size() < n) {
                throw DeadlyImportError("OBJ: vertex normal index out of range");
            }
            memcpy(mesh->mNormals, pModel->m_Normals.data(), n*sizeof(aiVector3D));
        }

        if ( !pModel->m_VertexColors.empty() ){
            mesh->mColors[0] = new aiColor4D[mesh->mNumVertices];
            for (unsigned int i = 0; i < n; ++i) {
                if (i < pModel->m_VertexColors.size() ) {
                    const aiVector3D& color = pModel->m_VertexColors[i];
                    mesh->mColors[0][i] = aiColor4D(color.x, color.y, color.z, 1.0);
                }else {
                    throw DeadlyImportError("OBJ: vertex color index out of range");
                }
            }
        }

        pScene->mRootNode->mNumMeshes = 1;
        pScene->mRootNode->mMeshes = new unsigned int[1];
        pScene->mRootNode->mMeshes[0] = 0;
        pScene->mMeshes = new aiMesh*[1];
        pScene->mNumMeshes = 1;
        pScene->mMeshes[0] = mesh.release();
    }
}